

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O3

bool Js::JavascriptNativeOperators::CheckIfTypeIsEquivalentForFixedField
               (Type *type,JitEquivalentTypeGuard *guard)

{
  bool bVar1;
  
  if ((guard->super_JitIndexedPropertyGuard).super_PropertyGuard.value == 2) {
    return false;
  }
  bVar1 = CheckIfTypeIsEquivalent(type,guard);
  return bVar1;
}

Assistant:

bool JavascriptNativeOperators::CheckIfTypeIsEquivalentForFixedField(Type* type, JitEquivalentTypeGuard* guard)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(CheckIfTypeIsEquivalentForFixedField);
        JIT_HELPER_SAME_ATTRIBUTES(CheckIfTypeIsEquivalentForFixedField, CheckIfTypeIsEquivalent);
        if (guard->GetValue() == PropertyGuard::GuardValue::Invalidated_DuringSweep)
        {
            return false;
        }
        return CheckIfTypeIsEquivalent(type, guard);
        JIT_HELPER_END(CheckIfTypeIsEquivalentForFixedField);
    }